

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationValue.cpp
# Opt level: O0

string * __thiscall
Corrade::Utility::Implementation::IntegerConfigurationValue<unsigned_short>::toString_abi_cxx11_
          (string *__return_storage_ptr__,IntegerConfigurationValue<unsigned_short> *this,
          unsigned_short *value,ConfigurationValueFlags flags)

{
  bool bVar1;
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_1b0;
  EnumSet local_1af;
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_1ae;
  EnumSet local_1ad [19];
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_19a;
  EnumSet local_199;
  long local_198;
  ostringstream stream;
  unsigned_short *value_local;
  string *psStack_10;
  ConfigurationValueFlags flags_local;
  
  value_local._7_1_ = SUB81(value,0);
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
            (&local_19a,Hex);
  local_199 = (EnumSet)Containers::
                       EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::
                       operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                  *)((long)&value_local + 7),local_19a);
  bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_199);
  if (bVar1) {
    std::ios_base::setf((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),_S_hex,
                        _S_basefield);
  }
  else {
    Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_1ae,Oct);
    local_1ad[0] = (EnumSet)Containers::
                            EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>
                            ::operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                         *)((long)&value_local + 7),local_1ae);
    bVar1 = Containers::EnumSet::operator_cast_to_bool(local_1ad);
    if (bVar1) {
      std::ios_base::setf((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),_S_oct,
                          _S_basefield);
    }
  }
  Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
            (&local_1b0,Uppercase);
  local_1af = (EnumSet)Containers::
                       EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::
                       operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                  *)((long)&value_local + 7),local_1b0);
  bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_1af);
  if (bVar1) {
    std::ios_base::setf((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),_S_uppercase);
  }
  std::ostream::operator<<(&local_198,*(ushort *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string IntegerConfigurationValue<T>::toString(const T& value, ConfigurationValueFlags flags) {
        std::ostringstream stream;

        /* Hexadecimal / octal values */
        if(flags & ConfigurationValueFlag::Hex)
            stream.setf(std::istringstream::hex, std::istringstream::basefield);
        else if(flags & ConfigurationValueFlag::Oct)
            stream.setf(std::istringstream::oct, std::istringstream::basefield);

        if(flags & ConfigurationValueFlag::Uppercase)
            stream.setf(std::istringstream::uppercase);

        stream << value;
        return stream.str();
    }